

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::Graph::addSpecialisationParameter(Graph *this,ProcessorAliasDeclaration *alias)

{
  pool_ref<soul::AST::ProcessorAliasDeclaration> local_20;
  
  local_20.object = alias;
  std::
  vector<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>>>
  ::emplace_back<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>>
            ((vector<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>>>
              *)&this->processorAliases,&local_20);
  local_20.object = alias;
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
  ::emplace_back<soul::pool_ref<soul::AST::ASTObject>>
            ((vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
              *)&(this->super_ProcessorBase).super_ModuleBase.specialisationParams,
             (pool_ref<soul::AST::ASTObject> *)&local_20);
  return;
}

Assistant:

void addSpecialisationParameter (ProcessorAliasDeclaration& alias) override
        {
            processorAliases.push_back (alias);
            specialisationParams.push_back (alias);
        }